

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_allocateLiteralsBuffer
               (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,size_t litSize,
               streaming_operation streaming,size_t expectedWriteSize,uint splitImmediately)

{
  size_t expectedWriteSize_local;
  streaming_operation streaming_local;
  size_t litSize_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  if ((streaming == not_streaming) && (litSize + 0x20040 < dstCapacity)) {
    dctx->litBuffer = (BYTE *)((long)dst + 0x20020);
    dctx->litBufferEnd = dctx->litBuffer + litSize;
    dctx->litBufferLocation = ZSTD_in_dst;
  }
  else if (litSize < 0x10001) {
    dctx->litBuffer = dctx->litExtraBuffer;
    dctx->litBufferEnd = dctx->litBuffer + litSize;
    dctx->litBufferLocation = ZSTD_not_in_dst;
  }
  else {
    if (splitImmediately == 0) {
      dctx->litBuffer = (BYTE *)((long)dst + (expectedWriteSize - litSize));
      dctx->litBufferEnd = (BYTE *)((long)dst + expectedWriteSize);
    }
    else {
      dctx->litBuffer = (BYTE *)((long)dst + (expectedWriteSize - litSize) + 0xffe0);
      dctx->litBufferEnd = dctx->litBuffer + (litSize - 0x10000);
    }
    dctx->litBufferLocation = ZSTD_split;
  }
  return;
}

Assistant:

static void ZSTD_allocateLiteralsBuffer(ZSTD_DCtx* dctx, void* const dst, const size_t dstCapacity, const size_t litSize,
    const streaming_operation streaming, const size_t expectedWriteSize, const unsigned splitImmediately)
{
    if (streaming == not_streaming && dstCapacity > ZSTD_BLOCKSIZE_MAX + WILDCOPY_OVERLENGTH + litSize + WILDCOPY_OVERLENGTH)
    {
        /* room for litbuffer to fit without read faulting */
        dctx->litBuffer = (BYTE*)dst + ZSTD_BLOCKSIZE_MAX + WILDCOPY_OVERLENGTH;
        dctx->litBufferEnd = dctx->litBuffer + litSize;
        dctx->litBufferLocation = ZSTD_in_dst;
    }
    else if (litSize > ZSTD_LITBUFFEREXTRASIZE)
    {
        /* won't fit in litExtraBuffer, so it will be split between end of dst and extra buffer */
        if (splitImmediately) {
            /* won't fit in litExtraBuffer, so it will be split between end of dst and extra buffer */
            dctx->litBuffer = (BYTE*)dst + expectedWriteSize - litSize + ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH;
            dctx->litBufferEnd = dctx->litBuffer + litSize - ZSTD_LITBUFFEREXTRASIZE;
        }
        else {
            /* initially this will be stored entirely in dst during huffman decoding, it will partially be shifted to litExtraBuffer after */
            dctx->litBuffer = (BYTE*)dst + expectedWriteSize - litSize;
            dctx->litBufferEnd = (BYTE*)dst + expectedWriteSize;
        }
        dctx->litBufferLocation = ZSTD_split;
    }
    else
    {
        /* fits entirely within litExtraBuffer, so no split is necessary */
        dctx->litBuffer = dctx->litExtraBuffer;
        dctx->litBufferEnd = dctx->litBuffer + litSize;
        dctx->litBufferLocation = ZSTD_not_in_dst;
    }
}